

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<double>::ParseHex(char *s,char *end,Uint *out_bits)

{
  bool bVar1;
  Result result;
  int iVar2;
  int iVar3;
  Uint UVar4;
  char *pcVar5;
  bool bVar6;
  int shift;
  int significand_bits;
  uint32_t digit_1;
  int significand_exponent_add;
  bool exponent_is_neg;
  int exponent;
  int local_3c;
  uint32_t digit;
  int significand_exponent;
  Uint significand;
  bool seen_dot;
  Uint *pUStack_28;
  bool is_neg;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  significand._7_1_ = 0;
  if (*s == '-') {
    significand._7_1_ = 1;
    end_local = s + 1;
  }
  else {
    end_local = s;
    if (*s == '+') {
      end_local = s + 1;
    }
  }
  pUStack_28 = out_bits;
  out_bits_local = (Uint *)end;
  bVar1 = StringStartsWith(end_local,end,"0x");
  if (!bVar1) {
    __assert_fail("StringStartsWith(s, end, \"0x\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                  ,0xfe,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                 );
  }
  significand._6_1_ = 0;
  _digit = 0;
  local_3c = 0;
  for (end_local = end_local + 2; end_local < out_bits_local; end_local = end_local + 1) {
    if (*end_local != '_') {
      if (*end_local == '.') {
        significand._6_1_ = 1;
      }
      else {
        result = ParseHexdigit(*end_local,(uint32_t *)&exponent);
        bVar1 = Succeeded(result);
        if (!bVar1) break;
        iVar2 = Clz(_digit);
        if (0x40 - iVar2 < 0x36) {
          _digit = _digit * 0x10 + (ulong)(uint)exponent;
          if ((significand._6_1_ & 1) != 0) {
            local_3c = local_3c + -4;
          }
        }
        else if ((significand._6_1_ & 1) == 0) {
          local_3c = local_3c + 4;
        }
      }
    }
  }
  if (_digit == 0) {
    UVar4 = Make((bool)(significand._7_1_ & 1),-0x3ff,0);
    *pUStack_28 = UVar4;
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  else {
    significand_exponent_add = 0;
    bVar1 = false;
    if (end_local < out_bits_local) {
      bVar6 = true;
      if (*end_local != 'p') {
        bVar6 = *end_local == 'P';
      }
      if (!bVar6) {
        __assert_fail("*s == \'p\' || *s == \'P\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                      ,0x128,
                      "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                     );
      }
      pcVar5 = end_local + 1;
      significand_bits = 0;
      if (*pcVar5 == '-') {
        bVar1 = true;
        significand_bits = -local_3c;
        pcVar5 = end_local + 2;
      }
      else if (*pcVar5 == '+') {
        significand_bits = local_3c;
        pcVar5 = end_local + 2;
      }
      while (end_local = pcVar5, end_local < out_bits_local) {
        if (*end_local != '_') {
          if (9 < (int)*end_local - 0x30U) {
            __assert_fail("digit <= 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/literal.cc"
                          ,0x13d,
                          "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseHex(const char *, const char *, Uint *) [T = double]"
                         );
          }
          significand_exponent_add = significand_exponent_add * 10 + ((int)*end_local - 0x30U);
          if (0x3ff < significand_exponent_add + significand_bits) break;
        }
        pcVar5 = end_local + 1;
      }
    }
    if (bVar1) {
      significand_exponent_add = -significand_exponent_add;
    }
    iVar2 = Clz(_digit);
    iVar2 = -iVar2;
    iVar3 = iVar2 + 0x40;
    significand_exponent_add = local_3c + iVar3 + -1 + significand_exponent_add;
    if (significand_exponent_add < -0x3fe) {
      if (iVar3 < 0x35) {
        if (iVar3 < 0x34) {
          _digit = _digit << (0x34U - (char)iVar3 & 0x3f);
        }
      }
      else {
        _digit = ShiftAndRoundToNearest(_digit,iVar2 + 0xc);
      }
      iVar2 = -0x3ff - significand_exponent_add;
      if (iVar2 < 0x34) {
        if (iVar2 != 0) {
          UVar4 = ShiftAndRoundToNearest(_digit,iVar2);
          _digit = UVar4 & 0xfffffffffffff;
        }
        if (_digit != 0) {
          UVar4 = Make((bool)(significand._7_1_ & 1),-0x3ff,_digit);
          *pUStack_28 = UVar4;
          Result::Result((Result *)((long)&s_local + 4),Ok);
          return (Result)s_local._4_4_;
        }
      }
      UVar4 = Make((bool)(significand._7_1_ & 1),-0x3ff,0);
      *pUStack_28 = UVar4;
    }
    else {
      if (iVar3 < 0x36) {
        if (iVar3 < 0x35) {
          _digit = _digit << (0x35U - (char)iVar3 & 0x3f);
        }
      }
      else {
        _digit = ShiftAndRoundToNearest(_digit,iVar2 + 0xb);
        if (0x1fffffffffffff < _digit) {
          significand_exponent_add = significand_exponent_add + 1;
        }
      }
      if (0x3ff < significand_exponent_add) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      UVar4 = Make((bool)(significand._7_1_ & 1),significand_exponent_add,_digit & 0xfffffffffffff);
      *pUStack_28 = UVar4;
    }
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result FloatParser<T>::ParseHex(const char* s,
                                const char* end,
                                Uint* out_bits) {
  bool is_neg = false;
  if (*s == '-') {
    is_neg = true;
    s++;
  } else if (*s == '+') {
    s++;
  }
  assert(StringStartsWith(s, end, "0x"));
  s += 2;

  // Loop over the significand; everything up to the 'p'.
  // This code is a bit nasty because we want to support extra zeroes anywhere
  // without having to use many significand bits.
  // e.g.
  // 0x00000001.0p0 => significand = 1, significand_exponent = 0
  // 0x10000000.0p0 => significand = 1, significand_exponent = 28
  // 0x0.000001p0 => significand = 1, significand_exponent = -24
  bool seen_dot = false;
  Uint significand = 0;
  int significand_exponent = 0;  // Exponent adjustment due to dot placement.
  for (; s < end; ++s) {
    uint32_t digit;
    if (*s == '_') {
      continue;
    } else if (*s == '.') {
      seen_dot = true;
    } else if (Succeeded(ParseHexdigit(*s, &digit))) {
      if (Traits::kBits - Clz(significand) <= Traits::kSigPlusOneBits) {
        significand = (significand << 4) + digit;
        if (seen_dot) {
          significand_exponent -= 4;
        }
      } else if (!seen_dot) {
        significand_exponent += 4;
      }
    } else {
      break;
    }
  }

  if (significand == 0) {
    // 0 or -0.
    *out_bits = Make(is_neg, Traits::kMinExp, 0);
    return Result::Ok;
  }

  int exponent = 0;
  bool exponent_is_neg = false;
  if (s < end) {
    assert(*s == 'p' || *s == 'P');
    s++;
    // Exponent is always positive, but significand_exponent is signed.
    // significand_exponent_add is negated if exponent will be negative, so it
    // can be easily summed to see if the exponent is too large (see below).
    int significand_exponent_add = 0;
    if (*s == '-') {
      exponent_is_neg = true;
      significand_exponent_add = -significand_exponent;
      s++;
    } else if (*s == '+') {
      s++;
      significand_exponent_add = significand_exponent;
    }

    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }

      uint32_t digit = (*s - '0');
      assert(digit <= 9);
      exponent = exponent * 10 + digit;
      if (exponent + significand_exponent_add >= Traits::kMaxExp) {
        break;
      }
    }
  }

  if (exponent_is_neg) {
    exponent = -exponent;
  }

  int significand_bits = Traits::kBits - Clz(significand);
  // -1 for the implicit 1 bit of the significand.
  exponent += significand_exponent + significand_bits - 1;

  if (exponent <= Traits::kMinExp) {
    // Maybe subnormal.
    if (significand_bits > Traits::kSigBits) {
      significand = ShiftAndRoundToNearest(significand,
                                           significand_bits - Traits::kSigBits);
    } else if (significand_bits < Traits::kSigBits) {
      significand <<= (Traits::kSigBits - significand_bits);
    }

    int shift = Traits::kMinExp - exponent;
    if (shift < Traits::kSigBits) {
      if (shift) {
        significand =
            ShiftAndRoundToNearest(significand, shift) & Traits::kSigMask;
      }
      exponent = Traits::kMinExp;

      if (significand != 0) {
        *out_bits = Make(is_neg, exponent, significand);
        return Result::Ok;
      }
    }

    // Not subnormal, too small; return 0 or -0.
    *out_bits = Make(is_neg, Traits::kMinExp, 0);
  } else {
    // Maybe Normal value.
    if (significand_bits > Traits::kSigPlusOneBits) {
      significand = ShiftAndRoundToNearest(
          significand, significand_bits - Traits::kSigPlusOneBits);
      if (significand > Traits::kSigPlusOneMask) {
        exponent++;
      }
    } else if (significand_bits < Traits::kSigPlusOneBits) {
      significand <<= (Traits::kSigPlusOneBits - significand_bits);
    }

    if (exponent >= Traits::kMaxExp) {
      // Would be inf or -inf, but the spec doesn't allow rounding hex-floats to
      // infinity.
      return Result::Error;
    }

    *out_bits = Make(is_neg, exponent, significand & Traits::kSigMask);
  }

  return Result::Ok;
}